

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

int __thiscall OpenMD::SimInfo::getFdf(SimInfo *this)

{
  SimInfo *this_local;
  
  this->fdf_ = this->fdf_local;
  return this->fdf_;
}

Assistant:

int SimInfo::getFdf() {
#ifdef IS_MPI
    MPI_Allreduce(&fdf_local, &fdf_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#else
    fdf_                       = fdf_local;
#endif
    return fdf_;
  }